

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles2::Functional::UniformCase::iterate(UniformCase *this)

{
  TestLog *log;
  UniformCollection *pUVar1;
  pointer pUVar2;
  RenderContext *renderCtx;
  deUint32 dVar3;
  uint uVar4;
  GLenum err;
  int iVar5;
  char *description;
  int i;
  long lVar6;
  long lVar7;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  basicUniforms;
  Random rnd;
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  basicUniformReportsRef;
  string fragmentSource;
  string vertexSource;
  ShaderProgram program;
  ProgramSources local_100;
  
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar4 = tcu::CommandLine::getBaseSeed(((this->super_TestCase).m_context)->m_testCtx->m_cmdLine);
  deRandom_init(&rnd.m_rnd,dVar3 ^ uVar4);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  basicUniforms.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  basicUniforms.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  basicUniforms.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  basicUniformReportsRef.
  super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  lVar7 = 0x20;
  for (lVar6 = 0; pUVar1 = (this->m_uniformCollection).m_ptr,
      pUVar2 = (pUVar1->m_uniforms).
               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar6 < (int)(((long)(pUVar1->m_uniforms).
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x38);
      lVar6 = lVar6 + 1) {
    generateBasicUniforms
              (this,&basicUniforms,&basicUniformReportsRef,
               (VarType *)((long)&(pUVar2->name)._M_dataplus._M_p + lVar7),
               *(char **)((long)pUVar2 + lVar7 + -0x20),true,(int *)&program,&rnd);
    lVar7 = lVar7 + 0x38;
  }
  generateVertexSource_abi_cxx11_(&vertexSource,this,&basicUniforms);
  generateFragmentSource_abi_cxx11_(&fragmentSource,this,&basicUniforms);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  glu::makeVtxFragSources(&local_100,&vertexSource,&fragmentSource);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,&local_100);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(log,&program);
  if (program.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compile failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,program.m_program.m_program);
    err = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(err,"glUseProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                    ,0x6e5);
    iVar5 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                      (this,&basicUniforms,&basicUniformReportsRef,&program,&rnd);
    description = "Failed";
    if ((byte)iVar5 != 0) {
      description = "Passed";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar5 ^ 1),description);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  std::__cxx11::string::~string((string *)&fragmentSource);
  std::__cxx11::string::~string((string *)&vertexSource);
  std::
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  ::~vector(&basicUniformReportsRef);
  std::
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  ::~vector(&basicUniforms);
  return STOP;
}

Assistant:

UniformCase::IterateResult UniformCase::iterate (void)
{
	Random							rnd				(deStringHash(getName()) ^ (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());
	TestLog&						log				= m_testCtx.getLog();
	vector<BasicUniform>			basicUniforms;
	vector<BasicUniformReportRef>	basicUniformReportsRef;

	{
		int samplerUnitCounter = 0;
		for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
			generateBasicUniforms(basicUniforms, basicUniformReportsRef, m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str(), true, samplerUnitCounter, rnd);
	}

	const string					vertexSource	= generateVertexSource(basicUniforms);
	const string					fragmentSource	= generateFragmentSource(basicUniforms);
	const ShaderProgram				program			(m_context.getRenderContext(), glu::makeVtxFragSources(vertexSource, fragmentSource));

	log << program;

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	const bool success = test(basicUniforms, basicUniformReportsRef, program, rnd);
	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							success ? "Passed"				: "Failed");

	return STOP;
}